

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

void __thiscall
xemmai::t_type_of<xemmai::t_object>::t_type_of<2ul>
          (t_type_of<xemmai::t_object> *this,array<const_void_*,_2UL> *a_ids,t_type *a_super,
          t_object *a_module,size_t a_native,size_t a_instance_fields,
          vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
          *a_fields,
          map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
          *a_key2index)

{
  t_slot *ptVar1;
  t_object *ptVar2;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  undefined8 *puVar3;
  _Rb_tree_node_base *p_Var4;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *paVar5;
  _func_size_t_t_object_ptr_t_pvalue_ptr **pp_Var6;
  
  t_slot::t_slot(&this->v_this,(t_object *)&this[-1].f_less);
  this->v_depth = 1;
  this->v_ids = a_ids->_M_elems;
  (this->v_super).v_p = (t_type_of<xemmai::t_object> *)0x0;
  (this->v_super).v_slot.v_p._M_b._M_p = (__pointer_type)0x0;
  t_slot::t_slot(&this->v_module,a_module);
  this->v_fields_offset = (a_native + 7 & 0xfffffffffffffff8) + 0x48;
  this->v_instance_fields = a_instance_fields;
  this->v_fields =
       ((long)(a_fields->
              super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a_fields->
              super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  this->v_builtin = false;
  this->v_revive = false;
  this->v_bindable = false;
  this->v_derive = 0;
  *(undefined8 *)&this->field_0x58 = 0;
  this->f_scan = f_do_scan;
  this->f_finalize = (_func_void_t_object_ptr_t_scan *)0x0;
  this->v_construct = (offset_in_t_type_to_subr)xemmai::t_type_of<xemmai::t_object>::f_do_construct;
  *(undefined8 *)&this->field_0x78 = 0;
  this->v_instantiate =
       (offset_in_t_type_to_subr)xemmai::t_type_of<xemmai::t_object>::f_do_instantiate;
  *(undefined8 *)&this->field_0x88 = 0;
  this->v_get = (offset_in_t_type_to_subr)xemmai::t_type_of<xemmai::t_object>::f_do_get;
  *(undefined8 *)&this->field_0x98 = 0;
  this->v_put = xemmai::t_type_of<xemmai::t_object>::f_do_put;
  this->v_has = (offset_in_t_type_to_subr)xemmai::t_type_of<xemmai::t_object>::f_do_has;
  *(undefined8 *)&this->field_0xb0 = 0;
  this->f_call = xemmai::t_type_of<xemmai::t_object>::f_do_call;
  this->f_string = xemmai::t_type_of<xemmai::t_object>::f_do_string;
  this->f_hash = xemmai::t_type_of<xemmai::t_object>::f_do_hash;
  this->f_get_at = xemmai::t_type_of<xemmai::t_object>::f_do_get_at;
  this->f_set_at = xemmai::t_type_of<xemmai::t_object>::f_do_set_at;
  this->f_plus = xemmai::t_type_of<xemmai::t_object>::f_do_plus;
  this->f_minus = xemmai::t_type_of<xemmai::t_object>::f_do_minus;
  this->f_complement = xemmai::t_type_of<xemmai::t_object>::f_do_complement;
  this->f_multiply = xemmai::t_type_of<xemmai::t_object>::f_do_multiply;
  this->f_divide = xemmai::t_type_of<xemmai::t_object>::f_do_divide;
  this->f_modulus = xemmai::t_type_of<xemmai::t_object>::f_do_modulus;
  this->f_add = xemmai::t_type_of<xemmai::t_object>::f_do_add;
  this->f_subtract = xemmai::t_type_of<xemmai::t_object>::f_do_subtract;
  this->f_left_shift = xemmai::t_type_of<xemmai::t_object>::f_do_left_shift;
  this->f_right_shift = xemmai::t_type_of<xemmai::t_object>::f_do_right_shift;
  this->f_less = xemmai::t_type_of<xemmai::t_object>::f_do_less;
  this->f_less_equal = xemmai::t_type_of<xemmai::t_object>::f_do_less_equal;
  this->f_greater = xemmai::t_type_of<xemmai::t_object>::f_do_greater;
  this->f_greater_equal = xemmai::t_type_of<xemmai::t_object>::f_do_greater_equal;
  this->f_equals = xemmai::t_type_of<xemmai::t_object>::f_do_equals;
  this->f_not_equals = xemmai::t_type_of<xemmai::t_object>::f_do_not_equals;
  this->f_and = xemmai::t_type_of<xemmai::t_object>::f_do_and;
  this->f_xor = xemmai::t_type_of<xemmai::t_object>::f_do_xor;
  this->f_or = xemmai::t_type_of<xemmai::t_object>::f_do_or;
  (this->v_super).v_p = a_super;
  pp_Var6 = &a_super[-1].f_less;
  if ((_func_size_t_t_object_ptr_t_pvalue_ptr **)0x4 < pp_Var6) {
    puVar3 = (undefined8 *)__tls_get_addr(&PTR_0010fe08);
    this_00 = (t_queue<128UL> *)*puVar3;
    *this_00->v_head = (t_object *)pp_Var6;
    if (this_00->v_head == this_00->v_next) {
      t_slot::t_queue<128UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  LOCK();
  ptVar1 = &(this->v_super).v_slot;
  ptVar2 = (ptVar1->v_p)._M_b._M_p;
  (ptVar1->v_p)._M_b._M_p = (__pointer_type)pp_Var6;
  UNLOCK();
  if ((t_object *)0x4 < ptVar2) {
    puVar3 = (undefined8 *)__tls_get_addr(&PTR_0010fe40);
    this_01 = (t_queue<256UL> *)*puVar3;
    *this_01->v_head = ptVar2;
    if (this_01->v_head == this_01->v_next) {
      t_slot::t_queue<256UL>::f_next(this_01);
    }
    else {
      this_01->v_head = this_01->v_head + 1;
    }
  }
  std::__uninitialized_copy<false>::
  __uninit_copy<__gnu_cxx::__normal_iterator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>const*,std::vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>>,std::pair<xemmai::t_slot,xemmai::t_value<xemmai::t_slot>>*>
            ((a_fields->
             super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (a_fields->
             super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (pair<xemmai::t_slot,_xemmai::t_value<xemmai::t_slot>_> *)(this + 1));
  p_Var4 = *(_Rb_tree_node_base **)(a_key2index + 0x18);
  if (p_Var4 != (_Rb_tree_node_base *)(a_key2index + 8)) {
    paVar5 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
             (&this[1].v_this + this->v_fields * 3);
    do {
      *paVar5 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)(p_Var4 + 1);
      (((t_value<xemmai::t_slot> *)(paVar5 + 1))->super_t_slot).v_p._M_b._M_p =
           (__pointer_type)p_Var4[1]._M_parent;
      paVar5 = paVar5 + 2;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != (_Rb_tree_node_base *)(a_key2index + 8));
  }
  return;
}

Assistant:

inline t_type::t_type_of(const std::array<t_type_id, A_n>& a_ids, t_type* a_super, t_object* a_module, size_t a_native, size_t a_instance_fields, const std::vector<std::pair<t_root, t_rvalue>>& a_fields, const std::map<t_object*, size_t>& a_key2index) : v_this(t_object::f_of(this)), v_depth(A_n - 1), v_ids(a_ids.data()), v_module(a_module), v_fields_offset(t_object::f_fields_offset(a_native)), v_instance_fields(a_instance_fields), v_fields(a_fields.size())
{
	v_super.f_construct(t_object::f_of(a_super));
	std::uninitialized_copy(a_fields.begin(), a_fields.end(), f_fields());
	std::copy(a_key2index.begin(), a_key2index.end(), f_key2index());
}